

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void parsegroup(rnndb *db,char *file,xmlNode *node)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  rnngroup **pprVar4;
  rnndelem *prVar5;
  void *pvVar6;
  rnndelem *delem;
  xmlNode *chain;
  rnngroup *cur;
  char *pcStack_30;
  int i;
  char *name;
  xmlAttr *attr;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  name = (char *)node->properties;
  pcStack_30 = (char *)0x0;
  for (; name != (char *)0x0; name = *(char **)(name + 0x30)) {
    iVar2 = strcmp(*(char **)(name + 0x10),"name");
    if (iVar2 == 0) {
      pcStack_30 = getattrib(db,file,(uint)node->line,(xmlAttr *)name);
    }
    else {
      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for group\n",file,(ulong)node->line,
              *(undefined8 *)(name + 0x10));
      db->estatus = 1;
    }
  }
  if (pcStack_30 == (char *)0x0) {
    fprintf(_stderr,"%s:%d: nameless group\n",file,(ulong)node->line);
    db->estatus = 1;
  }
  else {
    chain = (xmlNode *)0x0;
    for (cur._4_4_ = 0; cur._4_4_ < db->groupsnum; cur._4_4_ = cur._4_4_ + 1) {
      iVar2 = strcmp(db->groups[cur._4_4_]->name,pcStack_30);
      if (iVar2 == 0) {
        chain = (xmlNode *)db->groups[cur._4_4_];
        break;
      }
    }
    if (chain == (xmlNode *)0x0) {
      chain = (xmlNode *)calloc(0x18,1);
      pcVar3 = strdup(pcStack_30);
      chain->_private = pcVar3;
      if (db->groupsmax <= db->groupsnum) {
        if (db->groupsmax == 0) {
          db->groupsmax = 0x10;
        }
        else {
          db->groupsmax = db->groupsmax << 1;
        }
        pprVar4 = (rnngroup **)realloc(db->groups,(long)db->groupsmax << 3);
        db->groups = pprVar4;
      }
      iVar2 = db->groupsnum;
      db->groupsnum = iVar2 + 1;
      db->groups[iVar2] = (rnngroup *)chain;
    }
    for (delem = (rnndelem *)node->children; delem != (rnndelem *)0x0;
        delem = (rnndelem *)delem->subelems) {
      if (*(int *)&delem->name == 1) {
        prVar5 = trydelem(db,file,(xmlNode *)delem);
        if (prVar5 == (rnndelem *)0x0) {
          iVar2 = trytop(db,file,(xmlNode *)delem);
          if ((iVar2 == 0) && (iVar2 = trydoc(db,file,(xmlNode *)delem), iVar2 == 0)) {
            uVar1._0_4_ = delem->width;
            uVar1._4_4_ = delem->access;
            fprintf(_stderr,"%s:%d: wrong tag in group: <%s>\n",file,
                    (ulong)*(ushort *)&(delem->varinfo).varsets,uVar1);
            db->estatus = 1;
          }
        }
        else {
          if (*(int *)((long)&chain->name + 4) <= *(int *)&chain->name) {
            if (*(int *)((long)&chain->name + 4) == 0) {
              *(undefined4 *)((long)&chain->name + 4) = 0x10;
            }
            else {
              *(int *)((long)&chain->name + 4) = *(int *)((long)&chain->name + 4) << 1;
            }
            pvVar6 = realloc(*(void **)&chain->type,(long)*(int *)((long)&chain->name + 4) << 3);
            *(void **)&chain->type = pvVar6;
          }
          iVar2 = *(int *)&chain->name;
          *(int *)&chain->name = iVar2 + 1;
          *(rnndelem **)(*(long *)&chain->type + (long)iVar2 * 8) = prVar5;
        }
      }
    }
  }
  return;
}

Assistant:

static void parsegroup(struct rnndb *db, char *file, xmlNode *node) {
	xmlAttr *attr = node->properties;
	char *name = 0;
	int i;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			name = getattrib(db, file, node->line, attr);
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for group\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	if (!name) {
		fprintf (stderr, "%s:%d: nameless group\n", file, node->line);
		db->estatus = 1;
		return;
	}
	struct rnngroup *cur = 0;
	for (i = 0; i < db->groupsnum; i++)
		if (!strcmp(db->groups[i]->name, name)) {
			cur = db->groups[i];
			break;
		}
	if (!cur) {
		cur = calloc(sizeof *cur, 1);
		cur->name = strdup(name);
		ADDARRAY(db->groups, cur);
	}
	xmlNode *chain = node->children;
	while (chain) {
		struct rnndelem *delem;
		if (chain->type != XML_ELEMENT_NODE) {
		} else if ((delem = trydelem(db, file, chain))) {
			ADDARRAY(cur->subelems, delem);
		} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in group: <%s>\n", file, chain->line, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
}